

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

bool __thiscall
OpenMD::EqualIgnoreCaseConstraint::operator()(EqualIgnoreCaseConstraint *this,string *data)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  locale local_38 [8];
  locale *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  std::locale::locale(local_38);
  toUpperCopy<std::__cxx11::string>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  _Var1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::locale::~locale(local_38);
  return _Var1;
}

Assistant:

bool operator()(std::string data) const {
      return OpenMD::toUpperCopy(data) == rhs_;
    }